

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File
          (CodeGeneratorResponse_File *this)

{
  CodeGeneratorResponse_File *pCVar1;
  CodeGeneratorResponse_File *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_File_006f4950;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,4);
  pCVar1 = internal_default_instance();
  if (this != pCVar1) {
    protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

CodeGeneratorResponse_File::CodeGeneratorResponse_File()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.compiler.CodeGeneratorResponse.File)
}